

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcEdgeLogLikelihoods
          (BeagleCPUSSEImpl<double,_2,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int *piVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  double *pdVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  pdVar10 = (this->super_BeagleCPUImpl<double,_2,_0>).gPartials[parIndex];
  pdVar11 = (this->super_BeagleCPUImpl<double,_2,_0>).gTransitionMatrices[probIndex];
  pdVar12 = (this->super_BeagleCPUImpl<double,_2,_0>).gCategoryWeights[categoryWeightsIndex];
  pdVar13 = (this->super_BeagleCPUImpl<double,_2,_0>).gStateFrequencies[stateFrequenciesIndex];
  memset((this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<double,_2,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount * 8);
  if ((childIndex < (this->super_BeagleCPUImpl<double,_2,_0>).kTipCount) &&
     (piVar14 = (this->super_BeagleCPUImpl<double,_2,_0>).gTipStates[childIndex],
     piVar14 != (int *)0x0)) {
    uVar6 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
    uVar7 = (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
    lVar22 = 0;
    for (uVar21 = 0; uVar21 != (~((int)uVar7 >> 0x1f) & uVar7); uVar21 = uVar21 + 1) {
      iVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize;
      uVar9 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
      lVar23 = (long)(this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
      lVar22 = (long)(int)lVar22;
      lVar27 = 0;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = pdVar12[uVar21];
      pdVar24 = pdVar10 + lVar22;
      for (uVar26 = 0; uVar26 != (~((int)uVar6 >> 0x1f) & uVar6); uVar26 = uVar26 + 1) {
        iVar18 = (this->super_BeagleCPUImpl<double,_2,_0>).kTransPaddedStateCount;
        lVar27 = (long)(int)lVar27;
        pdVar17 = (this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp;
        pdVar16 = pdVar11 + (long)(iVar8 * (int)uVar21) + (long)piVar14[uVar26];
        for (uVar19 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar19; uVar19 = uVar19 + 1) {
          dVar29 = *pdVar16;
          pdVar16 = pdVar16 + iVar18;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar17[lVar27 + uVar19];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar29 * pdVar24[uVar19];
          auVar1 = vfmadd213sd_fma(auVar32,auVar30,auVar1);
          pdVar17[lVar27 + uVar19] = auVar1._0_8_;
        }
        lVar27 = lVar27 + uVar19;
        lVar22 = lVar22 + lVar23;
        pdVar24 = pdVar24 + lVar23;
      }
    }
  }
  else {
    pdVar24 = (this->super_BeagleCPUImpl<double,_2,_0>).gPartials[childIndex];
    uVar6 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
    uVar7 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
    uVar9 = (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
    lVar22 = 0;
    for (uVar21 = 0; uVar21 != (~((int)uVar9 >> 0x1f) & uVar9); uVar21 = uVar21 + 1) {
      lVar23 = (long)(this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
      iVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize;
      lVar22 = (long)(int)lVar22;
      lVar27 = 0;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pdVar12[uVar21];
      pdVar16 = pdVar24 + lVar22 + 2;
      pdVar17 = pdVar24 + lVar22;
      for (uVar20 = 0; uVar20 != (~((int)uVar7 >> 0x1f) & uVar7); uVar20 = uVar20 + 1) {
        pdVar15 = (this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp;
        lVar27 = (long)(int)lVar27;
        uVar26 = 0;
        iVar18 = iVar8 * (int)uVar21;
        while (uVar26 != (~((int)uVar6 >> 0x1f) & uVar6)) {
          auVar30 = ZEXT816(0) << 0x40;
          pdVar28 = pdVar17;
          for (lVar25 = 0; auVar1 = auVar30, lVar25 < (int)uVar6 / 4 << 2; lVar25 = lVar25 + 4) {
            pdVar28 = pdVar28 + 4;
            auVar30 = vfmadd231pd_fma(auVar30,*(undefined1 (*) [16])(pdVar11 + iVar18 + lVar25),
                                      *(undefined1 (*) [16])(pdVar16 + lVar25 + -2));
            auVar30 = vfmadd231pd_fma(auVar30,*(undefined1 (*) [16])
                                               (pdVar11 + (long)iVar18 + lVar25 + 2),
                                      *(undefined1 (*) [16])(pdVar16 + lVar25));
          }
          while (lVar25 < (int)uVar6) {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = pdVar11[iVar18 + lVar25];
            lVar25 = lVar25 + 1;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *pdVar28;
            auVar1 = vfmadd231sd_fma(auVar1,auVar36,auVar2);
            pdVar28 = pdVar28 + 1;
          }
          auVar30 = vshufpd_avx(auVar30,auVar30,1);
          iVar18 = iVar18 + uVar6 + 2;
          lVar25 = lVar22 + uVar26;
          uVar26 = uVar26 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar15[lVar27];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = (auVar30._0_8_ + auVar1._0_8_) * pdVar10[lVar25];
          auVar30 = vfmadd213sd_fma(auVar33,auVar31,auVar3);
          pdVar15[lVar27] = auVar30._0_8_;
          lVar27 = lVar27 + 1;
        }
        lVar22 = lVar22 + lVar23;
        pdVar16 = pdVar16 + lVar23;
        pdVar17 = pdVar17 + lVar23;
      }
    }
  }
  lVar22 = 0;
  for (lVar23 = 0; uVar6 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount,
      lVar23 < (int)uVar6; lVar23 = lVar23 + 1) {
    uVar6 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
    auVar30 = ZEXT816(0) << 0x40;
    uVar21 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
    for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
      auVar34._8_8_ = 0;
      auVar34._0_8_ = pdVar13[uVar26];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp
                     [(long)(int)lVar22 + uVar26];
      auVar30 = vfmadd231sd_fma(auVar30,auVar34,auVar4);
    }
    lVar22 = (long)(int)lVar22 + uVar21;
    dVar29 = log(auVar30._0_8_);
    (this->super_BeagleCPUImpl<double,_2,_0>).outLogLikelihoodsTmp[lVar23] = dVar29;
  }
  if (scalingFactorsIndex == -1) {
    uVar21 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
  }
  else {
    pdVar10 = (this->super_BeagleCPUImpl<double,_2,_0>).outLogLikelihoodsTmp;
    pdVar11 = (this->super_BeagleCPUImpl<double,_2,_0>).gScaleBuffers[scalingFactorsIndex];
    uVar21 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
    for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
      pdVar10[uVar26] = pdVar11[uVar26] + pdVar10[uVar26];
    }
  }
  *outSumLogLikelihood = 0.0;
  auVar30 = ZEXT816(0) << 0x40;
  pdVar10 = (this->super_BeagleCPUImpl<double,_2,_0>).gPatternWeights;
  pdVar11 = (this->super_BeagleCPUImpl<double,_2,_0>).outLogLikelihoodsTmp;
  for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
    auVar35._8_8_ = 0;
    auVar35._0_8_ = pdVar11[uVar26];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar10[uVar26];
    auVar30 = vfmadd231sd_fma(auVar30,auVar35,auVar5);
    *outSumLogLikelihood = auVar30._0_8_;
  }
  return (uint)!NAN(auVar30._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
int BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
return BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(
                                                    parIndex,
                                                    childIndex,
                                                    probIndex,
                                                    categoryWeightsIndex,
                                                    stateFrequenciesIndex,
                                                    scalingFactorsIndex,
                                                    outSumLogLikelihood);
}